

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

void monitor_callback(GLFWmonitor *monitor,int event)

{
  uint uVar1;
  GLFWvidmode *pGVar2;
  char *pcVar3;
  double dVar4;
  GLFWvidmode *mode;
  int local_20;
  int heightMM;
  int widthMM;
  int y;
  int x;
  int event_local;
  GLFWmonitor *monitor_local;
  
  uVar1 = counter;
  y = event;
  _x = monitor;
  if (event == 0x40001) {
    pGVar2 = glfwGetVideoMode(monitor);
    glfwGetMonitorPos(_x,&widthMM,&heightMM);
    glfwGetMonitorPhysicalSize(_x,&local_20,(int *)((long)&mode + 4));
    uVar1 = counter;
    counter = counter + 1;
    dVar4 = glfwGetTime();
    pcVar3 = glfwGetMonitorName(_x);
    printf("%08x at %0.3f: Monitor %s (%ix%i at %ix%i, %ix%i mm) was connected\n",dVar4,(ulong)uVar1
           ,pcVar3,(ulong)(uint)pGVar2->width,(ulong)(uint)pGVar2->height,(ulong)(uint)widthMM,
           heightMM,local_20,mode._4_4_);
  }
  else if (event == 0x40002) {
    counter = counter + 1;
    dVar4 = glfwGetTime();
    pcVar3 = glfwGetMonitorName(_x);
    printf("%08x at %0.3f: Monitor %s was disconnected\n",dVar4,(ulong)uVar1,pcVar3);
  }
  return;
}

Assistant:

static void monitor_callback(GLFWmonitor* monitor, int event)
{
    if (event == GLFW_CONNECTED)
    {
        int x, y, widthMM, heightMM;
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwGetMonitorPos(monitor, &x, &y);
        glfwGetMonitorPhysicalSize(monitor, &widthMM, &heightMM);

        printf("%08x at %0.3f: Monitor %s (%ix%i at %ix%i, %ix%i mm) was connected\n",
               counter++,
               glfwGetTime(),
               glfwGetMonitorName(monitor),
               mode->width, mode->height,
               x, y,
               widthMM, heightMM);
    }
    else if (event == GLFW_DISCONNECTED)
    {
        printf("%08x at %0.3f: Monitor %s was disconnected\n",
               counter++,
               glfwGetTime(),
               glfwGetMonitorName(monitor));
    }
}